

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::EndFrame(void)

{
  int *piVar1;
  ImVec2 IVar2;
  _func_void_int_int *p_Var3;
  char *__s1;
  ImGuiWindow **ppIVar4;
  unsigned_short *puVar5;
  bool bVar6;
  ImVec2 IVar7;
  ImGuiContext *pIVar8;
  ImGuiContext *pIVar9;
  int iVar10;
  float fVar11;
  byte bVar12;
  ImU32 key;
  ImGuiWindow *pIVar13;
  ImGuiWindow **ppIVar14;
  ulong uVar15;
  unsigned_short *__dest;
  uint uVar16;
  char *pcVar17;
  char *label;
  ImGuiContext *g;
  int iVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  uint uVar22;
  float fVar23;
  float fVar24;
  ImRect local_48;
  
  pIVar9 = GImGui;
  if (GImGui->Initialized == false) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x103f,"EndFrame","ImGui ASSERT FAILED: %s","g.Initialized");
  }
  if (pIVar9->FrameCountEnded != pIVar9->FrameCount) {
    if (pIVar9->WithinFrameScope == false) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                  ,0x1044,"EndFrame","ImGui ASSERT FAILED: %s",
                  "g.WithinFrameScope && \"Forgot to call ImGui::NewFrame()?\"");
    }
    pIVar8 = GImGui;
    iVar21 = (GImGui->CurrentWindowStack).Size;
    if (iVar21 != 1) {
      if (iVar21 < 2) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                    ,0x1aae,"ErrorCheckEndFrameSanityChecks","ImGui ASSERT FAILED: %s",
                    "(g.CurrentWindowStack.Size == 1) && \"Mismatched Begin/BeginChild vs End/EndChild calls: did you call End/EndChild too much?\""
                   );
      }
      else {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                    ,0x1aa8,"ErrorCheckEndFrameSanityChecks","ImGui ASSERT FAILED: %s",
                    "(g.CurrentWindowStack.Size == 1) && \"Mismatched Begin/BeginChild vs End/EndChild calls: did you forget to call End/EndChild?\""
                   );
        iVar21 = (pIVar8->CurrentWindowStack).Size;
        while (1 < iVar21) {
          End();
          iVar21 = (pIVar8->CurrentWindowStack).Size;
        }
      }
    }
    p_Var3 = (pIVar9->IO).ImeSetInputScreenPosFn;
    if (p_Var3 != (_func_void_int_int *)0x0) {
      fVar23 = (pIVar9->PlatformImeLastPos).x;
      if (((fVar23 == 3.4028235e+38) && (!NAN(fVar23))) ||
         (fVar23 = fVar23 - (pIVar9->PlatformImePos).x,
         fVar24 = (pIVar9->PlatformImeLastPos).y - (pIVar9->PlatformImePos).y,
         0.0001 < fVar23 * fVar23 + fVar24 * fVar24)) {
        (*p_Var3)((int)(pIVar9->PlatformImePos).x,(int)(pIVar9->PlatformImePos).y);
        pIVar9->PlatformImeLastPos = pIVar9->PlatformImePos;
      }
    }
    pIVar9->WithinFrameScopeWithImplicitWindow = false;
    pIVar13 = pIVar9->CurrentWindow;
    if ((pIVar13 != (ImGuiWindow *)0x0) && (pIVar13->WriteAccessed == false)) {
      pIVar13->Active = false;
    }
    End();
    pIVar8 = GImGui;
    if ((GImGui->NavWindowingTarget != (ImGuiWindow *)0x0) &&
       (0.15 < GImGui->NavWindowingTimer || GImGui->NavWindowingTimer == 0.15)) {
      if (GImGui->NavWindowingListWindow == (ImGuiWindow *)0x0) {
        key = ImHashStr("###NavWindowingList",0,0);
        pIVar13 = (ImGuiWindow *)ImGuiStorage::GetVoidPtr(&pIVar8->WindowsById,key);
        pIVar8->NavWindowingListWindow = pIVar13;
      }
      IVar2 = (pIVar8->IO).DisplaySize;
      fVar23 = IVar2.x;
      fVar24 = IVar2.y;
      IVar7.y = fVar24 * 0.2;
      IVar7.x = fVar23 * 0.2;
      (pIVar8->NextWindowData).SizeConstraintRect.Min = IVar7;
      (pIVar8->NextWindowData).SizeConstraintRect.Max.x = 3.4028235e+38;
      (pIVar8->NextWindowData).SizeConstraintRect.Max.y = 3.4028235e+38;
      (pIVar8->NextWindowData).SizeCallback = (ImGuiSizeCallback)0x0;
      (pIVar8->NextWindowData).SizeCallbackUserData = (void *)0x0;
      *(byte *)&(pIVar8->NextWindowData).Flags = (byte)(pIVar8->NextWindowData).Flags | 0x11;
      IVar2.y = fVar24 * 0.5;
      IVar2.x = fVar23 * 0.5;
      (pIVar8->NextWindowData).PosVal = IVar2;
      (pIVar8->NextWindowData).PosPivotVal.x = 0.5;
      (pIVar8->NextWindowData).PosPivotVal.y = 0.5;
      (pIVar8->NextWindowData).PosCond = 1;
      IVar2 = (pIVar8->Style).WindowPadding;
      fVar23 = IVar2.x;
      fVar24 = IVar2.y;
      local_48.Min.y = fVar24 + fVar24;
      local_48.Min.x = fVar23 + fVar23;
      PushStyleVar(1,&local_48.Min);
      Begin("###NavWindowingList",(bool *)0x0,0xc1347);
      lVar19 = (long)(pIVar8->WindowsFocusOrder).Size;
      if (0 < lVar19) {
        do {
          if ((pIVar8->WindowsFocusOrder).Size < lVar19) {
            LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                        ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
          }
          pIVar13 = (pIVar8->WindowsFocusOrder).Data[lVar19 + -1];
          if (((pIVar13->Active == true) && (pIVar13->RootWindow == pIVar13)) &&
             (uVar16 = pIVar13->Flags, (uVar16 >> 0x13 & 1) == 0)) {
            __s1 = pIVar13->Name;
            pcVar17 = __s1;
            if (__s1 != (char *)0xffffffffffffffff) {
              do {
                if (*pcVar17 == '#') {
                  if (pcVar17[1] == '#') goto LAB_0020bc85;
                }
                else if (*pcVar17 == '\0') goto LAB_0020bc85;
                pcVar17 = pcVar17 + 1;
              } while (pcVar17 != (char *)0xffffffffffffffff);
              pcVar17 = (char *)0xffffffffffffffff;
            }
LAB_0020bc85:
            label = __s1;
            if ((__s1 == pcVar17) && (label = "(Popup)", (uVar16 >> 0x1a & 1) == 0)) {
              if ((uVar16 >> 10 & 1) != 0) {
                iVar21 = strcmp(__s1,"##MainMenuBar");
                label = "(Main menu bar)";
                if (iVar21 == 0) goto LAB_0020bcc0;
              }
              label = "(Untitled)";
            }
LAB_0020bcc0:
            local_48.Min.x = 0.0;
            local_48.Min.y = 0.0;
            Selectable(label,pIVar8->NavWindowingTarget == pIVar13,0,&local_48.Min);
          }
          bVar6 = 1 < lVar19;
          lVar19 = lVar19 + -1;
        } while (bVar6);
      }
      End();
      PopStyleVar(1);
    }
    pIVar13 = pIVar8->NavWrapRequestWindow;
    if (((pIVar13 != (ImGuiWindow *)0x0) && (pIVar8->NavWindow == pIVar13)) &&
       ((GImGui->NavMoveRequest == true &&
        (((((GImGui->NavMoveResultLocal).ID == 0 && ((GImGui->NavMoveResultOther).ID == 0)) &&
          (pIVar8->NavMoveRequestForward == ImGuiNavForward_None)) &&
         (pIVar8->NavLayer == ImGuiNavLayer_Main)))))) {
      uVar16 = pIVar8->NavWrapRequestFlags;
      if (uVar16 == 0) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                    ,0x22c1,"NavEndFrame","ImGui ASSERT FAILED: %s","move_flags != 0");
      }
      local_48.Min = pIVar13->NavRectRel[0].Min;
      local_48.Max = pIVar13->NavRectRel[0].Max;
      iVar21 = pIVar8->NavMoveDir;
      if (iVar21 == 0) {
        if ((uVar16 & 5) == 0) {
          iVar21 = 0;
        }
        else {
          fVar23 = (pIVar13->SizeFull).x;
          fVar24 = (pIVar13->WindowPadding).x;
          fVar24 = fVar24 + fVar24 + (pIVar13->ContentSize).x;
          uVar22 = -(uint)(fVar24 <= fVar23);
          fVar23 = (float)(uVar22 & (uint)fVar23 | ~uVar22 & (uint)fVar24) - (pIVar13->Scroll).x;
          iVar21 = 0;
          if ((uVar16 & 4) != 0) {
            fVar24 = local_48.Max.y - local_48.Min.y;
            local_48.Min.y = local_48.Min.y - fVar24;
            local_48.Max.y = local_48.Max.y - fVar24;
            iVar21 = 2;
          }
          local_48.Max.x = fVar23;
          local_48.Min.x = fVar23;
          NavMoveRequestForward(0,iVar21,&local_48,uVar16);
        }
      }
      if ((uVar16 & 5) != 0 && pIVar8->NavMoveDir == 1) {
        fVar23 = (pIVar13->Scroll).x;
        fVar11 = local_48.Max.y;
        local_48.Max = (ImVec2)(CONCAT44(local_48.Max.y,fVar23) ^ 0x80000000);
        fVar24 = local_48.Min.y;
        local_48.Min = (ImVec2)(CONCAT44(local_48.Min.y,fVar23) ^ 0x80000000);
        if ((uVar16 & 4) != 0) {
          fVar23 = fVar11 - fVar24;
          local_48.Min.y = fVar24 + fVar23;
          local_48.Max.y = fVar23 + fVar11;
          iVar21 = 3;
        }
        NavMoveRequestForward(pIVar8->NavMoveDir,iVar21,&local_48,uVar16);
      }
      if ((uVar16 & 10) != 0 && pIVar8->NavMoveDir == 2) {
        fVar23 = (pIVar13->SizeFull).y;
        fVar24 = (pIVar13->WindowPadding).y;
        fVar24 = fVar24 + fVar24 + (pIVar13->ContentSize).y;
        uVar22 = -(uint)(fVar24 <= fVar23);
        fVar23 = (float)(uVar22 & (uint)fVar23 | ~uVar22 & (uint)fVar24) - (pIVar13->Scroll).y;
        if ((uVar16 & 8) != 0) {
          fVar24 = local_48.Max.x - local_48.Min.x;
          local_48.Min.x = local_48.Min.x - fVar24;
          local_48.Max.x = local_48.Max.x - fVar24;
          iVar21 = 0;
        }
        local_48.Max.y = fVar23;
        local_48.Min.y = fVar23;
        NavMoveRequestForward(pIVar8->NavMoveDir,iVar21,&local_48,uVar16);
      }
      if (pIVar8->NavMoveDir == 3 && (uVar16 & 10) != 0) {
        fVar23 = (pIVar13->Scroll).y;
        fVar11 = local_48.Max.x;
        local_48.Max = (ImVec2)(CONCAT44(fVar23,local_48.Max.x) ^ 0x8000000000000000);
        fVar24 = local_48.Min.x;
        local_48.Min = (ImVec2)(CONCAT44(fVar23,local_48.Min.x) ^ 0x8000000000000000);
        if ((uVar16 & 8) != 0) {
          fVar23 = fVar11 - fVar24;
          local_48.Min.x = fVar24 + fVar23;
          local_48.Max.x = fVar23 + fVar11;
          iVar21 = 1;
        }
        NavMoveRequestForward(pIVar8->NavMoveDir,iVar21,&local_48,uVar16);
      }
    }
    pIVar8 = GImGui;
    if (pIVar9->DragDropActive == true) {
      bVar6 = (pIVar9->DragDropPayload).Delivery;
      if ((pIVar9->DragDropPayload).DataFrameCount + 1 < pIVar9->FrameCount) {
        bVar12 = 1;
        if ((pIVar9->DragDropSourceFlags & 0x20) == 0) {
          iVar21 = pIVar9->DragDropMouseButton;
          if (4 < (ulong)(long)iVar21) {
            LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                        ,0x1159,"IsMouseDown","ImGui ASSERT FAILED: %s",
                        "button >= 0 && button < IM_ARRAYSIZE(g.IO.MouseDown)");
          }
          bVar12 = (pIVar8->IO).MouseDown[iVar21] ^ 1;
        }
      }
      else {
        bVar12 = 0;
      }
      if ((bVar12 != 0) || (bVar6 != false)) {
        ClearDragDrop();
      }
    }
    if (((pIVar9->DragDropActive == true) && (pIVar9->DragDropSourceFrameCount < pIVar9->FrameCount)
        ) && ((pIVar9->DragDropSourceFlags & 1) == 0)) {
      pIVar9->DragDropWithinSource = true;
      SetTooltip("...");
      pIVar9->DragDropWithinSource = false;
    }
    pIVar9->WithinFrameScope = false;
    pIVar9->FrameCountEnded = pIVar9->FrameCount;
    UpdateMouseMovingWindowEndFrame();
    iVar21 = (pIVar9->WindowsTempSortBuffer).Capacity;
    if (iVar21 < 0) {
      uVar16 = iVar21 / 2 + iVar21;
      uVar15 = 0;
      if (0 < (int)uVar16) {
        uVar15 = (ulong)uVar16;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      ppIVar14 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar15 * 8,GImAllocatorUserData);
      ppIVar4 = (pIVar9->WindowsTempSortBuffer).Data;
      if (ppIVar4 != (ImGuiWindow **)0x0) {
        memcpy(ppIVar14,ppIVar4,(long)(pIVar9->WindowsTempSortBuffer).Size << 3);
        ppIVar4 = (pIVar9->WindowsTempSortBuffer).Data;
        if ((ppIVar4 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar4,GImAllocatorUserData);
      }
      (pIVar9->WindowsTempSortBuffer).Data = ppIVar14;
      (pIVar9->WindowsTempSortBuffer).Capacity = (int)uVar15;
    }
    (pIVar9->WindowsTempSortBuffer).Size = 0;
    iVar21 = (pIVar9->Windows).Size;
    if ((pIVar9->WindowsTempSortBuffer).Capacity < iVar21) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      ppIVar14 = (ImGuiWindow **)(*GImAllocatorAllocFunc)((long)iVar21 << 3,GImAllocatorUserData);
      ppIVar4 = (pIVar9->WindowsTempSortBuffer).Data;
      if (ppIVar4 != (ImGuiWindow **)0x0) {
        memcpy(ppIVar14,ppIVar4,(long)(pIVar9->WindowsTempSortBuffer).Size << 3);
        ppIVar4 = (pIVar9->WindowsTempSortBuffer).Data;
        if ((ppIVar4 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar4,GImAllocatorUserData);
      }
      (pIVar9->WindowsTempSortBuffer).Data = ppIVar14;
      (pIVar9->WindowsTempSortBuffer).Capacity = iVar21;
    }
    uVar16 = (pIVar9->Windows).Size;
    uVar15 = (ulong)uVar16;
    if (uVar16 != 0) {
      uVar20 = 0;
      do {
        if ((long)(int)uVar15 <= (long)uVar20) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
        }
        pIVar13 = (pIVar9->Windows).Data[uVar20];
        if ((pIVar13->Active != true) || ((pIVar13->Flags & 0x1000000) == 0)) {
          AddWindowToSortBuffer(&pIVar9->WindowsTempSortBuffer,pIVar13);
        }
        uVar20 = uVar20 + 1;
        uVar16 = (pIVar9->Windows).Size;
        uVar15 = (ulong)uVar16;
      } while (uVar20 != uVar15);
    }
    if (uVar16 != (pIVar9->WindowsTempSortBuffer).Size) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                  ,0x107d,"EndFrame","ImGui ASSERT FAILED: %s",
                  "g.Windows.Size == g.WindowsTempSortBuffer.Size");
    }
    iVar18 = (pIVar9->WindowsTempSortBuffer).Size;
    iVar10 = (pIVar9->WindowsTempSortBuffer).Capacity;
    ppIVar4 = (pIVar9->WindowsTempSortBuffer).Data;
    iVar21 = (pIVar9->Windows).Capacity;
    ppIVar14 = (pIVar9->Windows).Data;
    (pIVar9->WindowsTempSortBuffer).Size = (pIVar9->Windows).Size;
    (pIVar9->WindowsTempSortBuffer).Capacity = iVar21;
    (pIVar9->WindowsTempSortBuffer).Data = ppIVar14;
    (pIVar9->Windows).Size = iVar18;
    (pIVar9->Windows).Capacity = iVar10;
    (pIVar9->Windows).Data = ppIVar4;
    (pIVar9->IO).MetricsActiveWindows = pIVar9->WindowsActiveCount;
    ((pIVar9->IO).Fonts)->Locked = false;
    (pIVar9->IO).MouseWheel = 0.0;
    (pIVar9->IO).MouseWheelH = 0.0;
    iVar21 = (pIVar9->IO).InputQueueCharacters.Capacity;
    if (iVar21 < 0) {
      iVar21 = iVar21 / 2 + iVar21;
      iVar18 = 0;
      if (0 < iVar21) {
        iVar18 = iVar21;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (unsigned_short *)
               (*GImAllocatorAllocFunc)((ulong)(uint)(iVar18 * 2),GImAllocatorUserData);
      puVar5 = (pIVar9->IO).InputQueueCharacters.Data;
      if (puVar5 != (unsigned_short *)0x0) {
        memcpy(__dest,puVar5,(long)(pIVar9->IO).InputQueueCharacters.Size * 2);
        puVar5 = (pIVar9->IO).InputQueueCharacters.Data;
        if ((puVar5 != (unsigned_short *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(puVar5,GImAllocatorUserData);
      }
      (pIVar9->IO).InputQueueCharacters.Data = __dest;
      (pIVar9->IO).InputQueueCharacters.Capacity = iVar18;
    }
    (pIVar9->IO).InputQueueCharacters.Size = 0;
    (pIVar9->IO).NavInputs[0] = 0.0;
    (pIVar9->IO).NavInputs[1] = 0.0;
    (pIVar9->IO).NavInputs[2] = 0.0;
    (pIVar9->IO).NavInputs[3] = 0.0;
    (pIVar9->IO).NavInputs[4] = 0.0;
    (pIVar9->IO).NavInputs[5] = 0.0;
    (pIVar9->IO).NavInputs[6] = 0.0;
    (pIVar9->IO).NavInputs[7] = 0.0;
    (pIVar9->IO).NavInputs[8] = 0.0;
    (pIVar9->IO).NavInputs[9] = 0.0;
    (pIVar9->IO).NavInputs[10] = 0.0;
    (pIVar9->IO).NavInputs[0xb] = 0.0;
    (pIVar9->IO).NavInputs[0xc] = 0.0;
    (pIVar9->IO).NavInputs[0xd] = 0.0;
    (pIVar9->IO).NavInputs[0xe] = 0.0;
    (pIVar9->IO).NavInputs[0xf] = 0.0;
    (pIVar9->IO).NavInputs[0x10] = 0.0;
    (pIVar9->IO).NavInputs[0x11] = 0.0;
    (pIVar9->IO).NavInputs[0x12] = 0.0;
    (pIVar9->IO).NavInputs[0x13] = 0.0;
    (pIVar9->IO).NavInputs[0x14] = 0.0;
  }
  return;
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    // Don't process EndFrame() multiple times.
    if (g.FrameCountEnded == g.FrameCount)
        return;
    IM_ASSERT(g.WithinFrameScope && "Forgot to call ImGui::NewFrame()?");

    ErrorCheckEndFrameSanityChecks();

    // Notify OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.IO.ImeSetInputScreenPosFn && (g.PlatformImeLastPos.x == FLT_MAX || ImLengthSqr(g.PlatformImeLastPos - g.PlatformImePos) > 0.0001f))
    {
        g.IO.ImeSetInputScreenPosFn((int)g.PlatformImePos.x, (int)g.PlatformImePos.y);
        g.PlatformImeLastPos = g.PlatformImePos;
    }

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.WithinFrameScopeWithImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Update navigation: CTRL+Tab, wrap-around requests
    NavEndFrame();

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
    {
        g.DragDropWithinSource = true;
        SetTooltip("...");
        g.DragDropWithinSource = false;
    }

    // End frame
    g.WithinFrameScope = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because children may not exist yet
    g.WindowsTempSortBuffer.resize(0);
    g.WindowsTempSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsTempSortBuffer, window);
    }

    // This usually assert if there is a mismatch between the ImGuiWindowFlags_ChildWindow / ParentWindow values and DC.ChildWindows[] in parents, aka we've done something wrong.
    IM_ASSERT(g.Windows.Size == g.WindowsTempSortBuffer.Size);
    g.Windows.swap(g.WindowsTempSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));
}